

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QPointer<QObject>_>::begin(QList<QPointer<QObject>_> *this)

{
  QPointer<QObject> *n;
  QArrayDataPointer<QPointer<QObject>_> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QPointer<QObject>_> *)0x3ff179);
  QArrayDataPointer<QPointer<QObject>_>::operator->(in_RDI);
  n = QArrayDataPointer<QPointer<QObject>_>::begin
                ((QArrayDataPointer<QPointer<QObject>_> *)0x3ff18a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }